

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O0

UDataMemory *
doLoadFromCommonData
          (UBool isICUData,char *param_2,char *param_3,char *param_4,char *tocEntryName,char *path,
          char *type,char *name,UDataMemoryIsAcceptable *isAcceptable,void *context,
          UErrorCode *subErrorCode,UErrorCode *pErrorCode)

{
  UBool UVar1;
  MappedData local_64;
  char local_5d;
  int32_t length;
  UBool checkedExtendedICUData;
  UDataMemory *pUStack_58;
  int32_t commonDataIndex;
  UDataMemory *pCommonData;
  DataHeader *pHeader;
  UDataMemory *pEntryData;
  char *path_local;
  char *tocEntryName_local;
  char *param_3_local;
  char *param_2_local;
  char *param_1_local;
  UBool isICUData_local;
  
  local_5d = '\0';
  length = -1;
  pEntryData = (UDataMemory *)path;
  path_local = tocEntryName;
  tocEntryName_local = param_4;
  param_3_local = param_3;
  param_2_local = param_2;
  param_1_local._7_1_ = isICUData;
  if (isICUData != '\0') {
    length = 0;
  }
  while( true ) {
    pUStack_58 = openCommonData((char *)pEntryData,length,subErrorCode);
    UVar1 = U_SUCCESS(*subErrorCode);
    if (((UVar1 != '\0') && (pUStack_58 != (UDataMemory *)0x0)) &&
       (pCommonData = (UDataMemory *)
                      (*pUStack_58->vFuncs->Lookup)
                                (pUStack_58,path_local,(int32_t *)&local_64,subErrorCode),
       pCommonData != (UDataMemory *)0x0)) {
      pHeader = (DataHeader *)
                checkDataItem((DataHeader *)pCommonData,isAcceptable,context,type,name,subErrorCode,
                              pErrorCode);
      UVar1 = U_FAILURE(*pErrorCode);
      if (UVar1 != '\0') {
        return (UDataMemory *)0x0;
      }
      if (pHeader != (DataHeader *)0x0) {
        pHeader[2].dataHeader = local_64;
        return (UDataMemory *)pHeader;
      }
    }
    if (*subErrorCode == U_MEMORY_ALLOCATION_ERROR) {
      *pErrorCode = *subErrorCode;
      return (UDataMemory *)0x0;
    }
    if (param_1_local._7_1_ == '\0') break;
    if (pUStack_58 == (UDataMemory *)0x0) {
      if ((local_5d != '\0') || (UVar1 = extendICUData(subErrorCode), UVar1 == '\0')) {
        return (UDataMemory *)0x0;
      }
      local_5d = '\x01';
    }
    else {
      length = length + 1;
    }
  }
  return (UDataMemory *)0x0;
}

Assistant:

static UDataMemory *doLoadFromCommonData(UBool isICUData, const char * /*pkgName*/, 
        const char * /*dataPath*/, const char * /*tocEntryPathSuffix*/, const char *tocEntryName,
            /* following arguments are the same as doOpenChoice itself */
            const char *path, const char *type, const char *name,
             UDataMemoryIsAcceptable *isAcceptable, void *context,
             UErrorCode *subErrorCode,
             UErrorCode *pErrorCode)
{
    UDataMemory        *pEntryData;
    const DataHeader   *pHeader;
    UDataMemory        *pCommonData;
    int32_t            commonDataIndex;
    UBool              checkedExtendedICUData = FALSE;
    /* try to get common data.  The loop is for platforms such as the 390 that do
     *  not initially load the full set of ICU data.  If the lookup of an ICU data item
     *  fails, the full (but slower to load) set is loaded, the and the loop repeats,
     *  trying the lookup again.  Once the full set of ICU data is loaded, the loop wont
     *  repeat because the full set will be checked the first time through.
     *
     *  The loop also handles the fallback to a .dat file if the application linked
     *   to the stub data library rather than a real library.
     */
    for (commonDataIndex = isICUData ? 0 : -1;;) {
        pCommonData=openCommonData(path, commonDataIndex, subErrorCode); /** search for pkg **/

        if(U_SUCCESS(*subErrorCode) && pCommonData!=NULL) {
            int32_t length;

            /* look up the data piece in the common data */
            pHeader=pCommonData->vFuncs->Lookup(pCommonData, tocEntryName, &length, subErrorCode);
#ifdef UDATA_DEBUG
            fprintf(stderr, "%s: pHeader=%p - %s\n", tocEntryName, pHeader, u_errorName(*subErrorCode));
#endif

            if(pHeader!=NULL) {
                pEntryData = checkDataItem(pHeader, isAcceptable, context, type, name, subErrorCode, pErrorCode);
#ifdef UDATA_DEBUG
                fprintf(stderr, "pEntryData=%p\n", pEntryData);
#endif
                if (U_FAILURE(*pErrorCode)) {
                    return NULL;
                }
                if (pEntryData != NULL) {
                    pEntryData->length = length;
                    return pEntryData;
                }
            }
        }
        // If we failed due to being out-of-memory, then stop early and report the error.
        if (*subErrorCode == U_MEMORY_ALLOCATION_ERROR) {
            *pErrorCode = *subErrorCode;
            return NULL;
        }
        /* Data wasn't found.  If we were looking for an ICUData item and there is
         * more data available, load it and try again,
         * otherwise break out of this loop. */
        if (!isICUData) {
            return NULL;
        } else if (pCommonData != NULL) {
            ++commonDataIndex;  /* try the next data package */
        } else if ((!checkedExtendedICUData) && extendICUData(subErrorCode)) {
            checkedExtendedICUData = TRUE;
            /* try this data package slot again: it changed from NULL to non-NULL */
        } else {
            return NULL;
        }
    }
}